

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.h
# Opt level: O0

void __thiscall BasicBlock::BasicBlock(BasicBlock *this,JitArenaAllocator *alloc,Func *func)

{
  Func *func_local;
  JitArenaAllocator *alloc_local;
  BasicBlock *this_local;
  
  this->next = (BasicBlock *)0x0;
  this->prev = (BasicBlock *)0x0;
  this->loop = (Loop *)0x0;
  this->field_0x18 = this->field_0x18 & 0xfe;
  this->field_0x18 = this->field_0x18 & 0xfd;
  this->field_0x18 = this->field_0x18 & 0xfb;
  this->field_0x18 = this->field_0x18 & 0xf7;
  this->field_0x18 = this->field_0x18 & 0xef;
  this->field_0x18 = this->field_0x18 & 0xbf;
  this->field_0x18 = this->field_0x18 & 0x7f;
  this->field_0x19 = this->field_0x19 & 0xfe;
  this->field_0x19 = this->field_0x19 & 0xfd;
  this->field_0x19 = this->field_0x19 & 0xfb;
  this->field_0x19 = this->field_0x19 & 0xf7;
  this->liveFixedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->typesNeedingKnownObjectLayout = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->slotDeadStoreCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->tempNumberTracker = (TempNumberTracker *)0x0;
  this->tempObjectTracker = (TempObjectTracker *)0x0;
  this->trackingByteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->excludeByteCodeUpwardExposedTracking = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->tempObjectVerifyTracker = (TempObjectVerifyTracker *)0x0;
  this->stackSymToFinalType = (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0;
  this->stackSymToGuardedProperties = (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0;
  this->stackSymToWriteGuardsMap = (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0;
  this->typeIDsWithFinalType = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->noImplicitCallUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->noImplicitCallNoMissingValuesUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->noImplicitCallNativeArrayUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->noImplicitCallJsArrayHeadSegmentSymUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->noImplicitCallArrayLengthSymUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->couldRemoveNegZeroBailoutForDef = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  GlobOptBlockData::GlobOptBlockData(&this->globOptData,func);
  this->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->byteCodeRestoreSyms = (StackSym **)0x0;
  this->intOverflowDoesNotMatterRange = (IntOverflowDoesNotMatterRange *)0x0;
  this->firstInstr = (Instr *)0x0;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator>::SListBaseCounted(&this->predList);
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator>::SListBaseCounted(&this->succList);
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator>::SListBaseCounted(&this->deadPredList);
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator>::SListBaseCounted(&this->deadSuccList);
  this->func = func;
  this->number = 0xffffffff;
  this->dataUseCount = 0;
  return;
}

Assistant:

BasicBlock(JitArenaAllocator * alloc, Func *func) :
        next(nullptr),
        prev(nullptr),
        firstInstr(nullptr),
        number(k_InvalidNum),
        loop(nullptr),
        isDeleted(false),
        isDead(false),
        isLoopHeader(false),
        hasCall(false),
        hasYield(false),
        liveFixedFields(nullptr),
        upwardExposedUses(nullptr),
        upwardExposedFields(nullptr),
        typesNeedingKnownObjectLayout(nullptr),
        slotDeadStoreCandidates(nullptr),
        tempNumberTracker(nullptr),
        tempObjectTracker(nullptr),
#if DBG
        tempObjectVerifyTracker(nullptr),
#endif
        stackSymToFinalType(nullptr),
        stackSymToGuardedProperties(nullptr),
        stackSymToWriteGuardsMap(nullptr),
        typeIDsWithFinalType(nullptr),
        noImplicitCallUses(nullptr),
        noImplicitCallNoMissingValuesUses(nullptr),
        noImplicitCallNativeArrayUses(nullptr),
        noImplicitCallJsArrayHeadSegmentSymUses(nullptr),
        noImplicitCallArrayLengthSymUses(nullptr),
        cloneStrCandidates(nullptr),
        couldRemoveNegZeroBailoutForDef(nullptr),
        byteCodeUpwardExposedUsed(nullptr),
        isAirLockCompensationBlock(false),
        beginsBailOnNoProfile(false),
#if DBG
        byteCodeRestoreSyms(nullptr),
        isBreakBlock(false),
        isAirLockBlock(false),
        isBreakCompensationBlockAtSource(false),
        isBreakCompensationBlockAtSink(false),
#endif
        dataUseCount(0),
        intOverflowDoesNotMatterRange(nullptr),
        func(func),
        globOptData(func)
    {
    }